

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_Near_Test::Body(iu_AssertionTest_x_iutest_x_Near_Test *this)

{
  AssertionResult iutest_ar;
  _Alloc_hider in_stack_fffffffffffffe10;
  bool local_1d0;
  iuCodeMessage local_1c8;
  int local_194;
  Fixed local_190;
  
  local_1c8.m_message._M_dataplus._M_p._0_4_ = 0;
  local_194 = 1;
  local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = 0x3ff8000000000000;
  iutest::internal::CmpHelperNear<int,double>
            ((AssertionResult *)&stack0xfffffffffffffe10,(internal *)0x30c9ec,"1","1.5",
             (char *)&local_1c8,&local_194,(int *)&local_190,
             (double *)in_stack_fffffffffffffe10._M_p);
  if (local_1d0 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xf4,in_stack_fffffffffffffe10._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 3;
    iutest::internal::CmpHelperNear<int>
              ((AssertionResult *)&stack0xfffffffffffffe10,"1.0f","4.0f","3",1.0,4.0,
               (int *)&local_190);
    if (local_1d0 == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xf5,in_stack_fffffffffffffe10._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperNear<int>
              ((AssertionResult *)&stack0xfffffffffffffe10,"2.0","1.0","2",2.0,1.0,(int *)&local_190
              );
    if (local_1d0 != false) goto LAB_0025b509;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xf6,in_stack_fffffffffffffe10._M_p);
    local_1c8._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0025b509:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  return;
}

Assistant:

IUTEST(AssertionTest, Near)
{
    IUTEST_ASSERT_NEAR(0, 1, 1.5);
    IUTEST_EXPECT_NEAR(1.0f, 4.0f, 3);
    IUTEST_INFORM_NEAR(2.0, 1.0, 2);
}